

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

uint32 crnd::crnd_get_crn_format_bits_per_texel(crn_format fmt)

{
  crn_format fmt_local;
  
  if (fmt == cCRNFmtDXT1) {
LAB_0011c42a:
    fmt_local._4_4_ = 4;
  }
  else {
    if (7 < (ulong)(fmt + cCRNFmtInvalid)) {
      if ((ulong)(fmt + ~cCRNFmtDXN_YX) < 3) goto LAB_0011c42a;
      if (fmt != cCRNFmtETC2A) {
        if (fmt == cCRNFmtETC1S) goto LAB_0011c42a;
        if (fmt != cCRNFmtETC2AS) {
          return 0;
        }
      }
    }
    fmt_local._4_4_ = 8;
  }
  return fmt_local._4_4_;
}

Assistant:

uint32 crnd_get_crn_format_bits_per_texel(crn_format fmt)
    {
        switch (fmt)
        {
            case cCRNFmtDXT1:
            case cCRNFmtDXT5A:
            case cCRNFmtETC1:
            case cCRNFmtETC2:
            case cCRNFmtETC1S:
                return 4;
            case cCRNFmtDXT3:
            case cCRNFmtDXT5:
            case cCRNFmtDXN_XY:
            case cCRNFmtDXN_YX:
            case cCRNFmtDXT5_CCxY:
            case cCRNFmtDXT5_xGxR:
            case cCRNFmtDXT5_xGBR:
            case cCRNFmtDXT5_AGBR:
            case cCRNFmtETC2A:
            case cCRNFmtETC2AS:
                return 8;
            default:
                break;
        }
        CRND_ASSERT(false);
        return 0;
    }